

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usertimer.cpp
# Opt level: O1

Real __thiscall soplex::UserTimer::stop(UserTimer *this)

{
  clock_t cVar1;
  tms local_28;
  
  if ((this->super_Timer).status == RUNNING) {
    cVar1 = times(&local_28);
    if ((int)cVar1 == -1) {
      local_28.tms_utime = 0;
    }
    this->uTicks = local_28.tms_utime;
    this->uAccount = this->uAccount + local_28.tms_utime;
    (this->super_Timer).status = STOPPED;
  }
  return (((double)this->uAccount * 1000.0) / (double)ticks_per_sec) / 1000.0;
}

Assistant:

Real UserTimer::stop()
{
   // status remains unchanged if timer is not running
   if(status == RUNNING)
   {
      updateTicks();

      uAccount += uTicks;
      status    = STOPPED;
   }

   return ticks2sec(uAccount);
}